

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

void __thiscall Polymer::Polymer(Polymer *this,string *name,int start,int stop)

{
  size_t *this_00;
  Mask local_1c0;
  undefined1 local_110 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  interaction_map;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_68;
  int local_20;
  int local_1c;
  int stop_local;
  int start_local;
  string *name_local;
  Polymer *this_local;
  
  local_20 = stop;
  local_1c = start;
  _stop_local = name;
  name_local = (string *)this;
  std::enable_shared_from_this<Polymer>::enable_shared_from_this
            (&this->super_enable_shared_from_this<Polymer>);
  this->_vptr_Polymer = (_func_int **)&PTR_Initialize_002aa5b8;
  Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::Signal(&this->termination_signal_);
  std::weak_ptr<PolymerWrapper>::weak_ptr(&this->wrapper_);
  std::__cxx11::string::string((string *)&this->name_,(string *)_stop_local);
  this->start_ = local_1c;
  this->stop_ = local_20;
  MobileElementManager::MobileElementManager(&this->polymerases_);
  this->degrade_ = false;
  this->attached_ = false;
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::vector(&this->binding_intervals_);
  std::
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ::vector(&this->release_intervals_);
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::IntervalTree(&this->binding_sites_);
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::IntervalTree(&this->release_sites_);
  local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_68._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_68._M_t._M_impl._0_8_ = 0;
  local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::map(&local_68);
  Mask::Mask(&this->mask_,0,0,&local_68);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~map(&local_68);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->uncovered_);
  MobileElementManager::MobileElementManager
            ((MobileElementManager *)
             &interaction_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  this_00 = &interaction_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
  MobileElementManager::operator=(&this->polymerases_,(MobileElementManager *)this_00);
  MobileElementManager::~MobileElementManager((MobileElementManager *)this_00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         *)local_110);
  Mask::Mask(&local_1c0,this->stop_ + 1,this->stop_,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)local_110);
  Mask::operator=(&this->mask_,&local_1c0);
  Mask::~Mask(&local_1c0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          *)local_110);
  return;
}

Assistant:

Polymer::Polymer(const std::string &name, int start, int stop)
    : name_(name),
      start_(start),
      stop_(stop) {
  polymerases_ = MobileElementManager();
  std::map<std::string, double> interaction_map;
  mask_ = Mask(stop_ + 1, stop_, interaction_map);
}